

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O3

bool bssl::ext_ri_add_clienthello
               (SSL_HANDSHAKE *hs,CBB *out,CBB *out_compressible,ssl_client_hello_type_t type)

{
  SSL *pSVar1;
  SSL3_STATE *pSVar2;
  bool bVar3;
  int iVar4;
  CBB prev_finished;
  CBB contents;
  CBB local_70;
  CBB local_40;
  
  bVar3 = true;
  if ((type != ssl_client_hello_inner) && (hs->min_version < 0x304)) {
    pSVar1 = hs->ssl;
    pSVar2 = pSVar1->s3;
    if ((bool)((pSVar2->field_0xdc & 0x10) >> 4) ==
        ((pSVar2->previous_client_finished).size_ == '\0')) {
      __assert_fail("ssl->s3->initial_handshake_complete == !ssl->s3->previous_client_finished.empty()"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0x2b2,
                    "bool bssl::ext_ri_add_clienthello(const SSL_HANDSHAKE *, CBB *, CBB *, ssl_client_hello_type_t)"
                   );
    }
    iVar4 = CBB_add_u16(out,0xff01);
    if ((((iVar4 != 0) && (iVar4 = CBB_add_u16_length_prefixed(out,&local_40), iVar4 != 0)) &&
        (iVar4 = CBB_add_u8_length_prefixed(&local_40,&local_70), iVar4 != 0)) &&
       (pSVar2 = pSVar1->s3,
       iVar4 = CBB_add_bytes(&local_70,(uint8_t *)&pSVar2->previous_client_finished,
                             (ulong)(pSVar2->previous_client_finished).size_), iVar4 != 0)) {
      iVar4 = CBB_flush(out);
      return iVar4 != 0;
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

static bool ext_ri_add_clienthello(const SSL_HANDSHAKE *hs, CBB *out,
                                   CBB *out_compressible,
                                   ssl_client_hello_type_t type) {
  const SSL *const ssl = hs->ssl;
  // Renegotiation indication is not necessary in TLS 1.3.
  if (hs->min_version >= TLS1_3_VERSION ||  //
      type == ssl_client_hello_inner) {
    return true;
  }

  assert(ssl->s3->initial_handshake_complete ==
         !ssl->s3->previous_client_finished.empty());

  CBB contents, prev_finished;
  if (!CBB_add_u16(out, TLSEXT_TYPE_renegotiate) ||
      !CBB_add_u16_length_prefixed(out, &contents) ||
      !CBB_add_u8_length_prefixed(&contents, &prev_finished) ||
      !CBB_add_bytes(&prev_finished, ssl->s3->previous_client_finished.data(),
                     ssl->s3->previous_client_finished.size()) ||
      !CBB_flush(out)) {
    return false;
  }

  return true;
}